

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O1

int next_concat(hd_context *ctx,hd_stream *stm,size_t max)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  hd_stream *stm_00;
  byte *pbVar4;
  size_t sVar5;
  
  pvVar2 = stm->state;
  do {
    iVar1 = *(int *)((long)pvVar2 + 8);
    if (*(int *)((long)pvVar2 + 4) <= iVar1) {
LAB_00112ee5:
      stm->rp = stm->wp;
      return -1;
    }
    lVar3 = *(long *)((long)pvVar2 + (long)iVar1 * 8 + 0x18);
    if (stm->wp == *(uchar **)(lVar3 + 0x20)) {
      *(uchar **)(lVar3 + 0x18) = stm->wp;
    }
    sVar5 = hd_available(ctx,*(hd_stream **)((long)pvVar2 + (long)iVar1 * 8 + 0x18),max);
    if (sVar5 != 0) {
      iVar1 = *(int *)((long)pvVar2 + 8);
      pbVar4 = *(byte **)(*(long *)((long)pvVar2 + (long)iVar1 * 8 + 0x18) + 0x18);
      stm->rp = pbVar4;
      stm->wp = *(uchar **)(*(long *)((long)pvVar2 + (long)iVar1 * 8 + 0x18) + 0x20);
      stm->pos = stm->pos + (int)sVar5;
      stm->rp = pbVar4 + 1;
      return (uint)*pbVar4;
    }
    stm_00 = *(hd_stream **)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 8) * 8 + 0x18);
    if (stm_00->error != 0) {
      stm->error = 1;
      goto LAB_00112ee5;
    }
    *(int *)((long)pvVar2 + 8) = *(int *)((long)pvVar2 + 8) + 1;
    hd_drop_stream(ctx,stm_00);
    if (*(int *)((long)pvVar2 + 0xc) != 0) {
      stm->rp = (uchar *)((long)pvVar2 + 0x11);
      stm->wp = (uchar *)((long)pvVar2 + 0x12);
      stm->pos = stm->pos + 1;
      return 0x20;
    }
  } while( true );
}

Assistant:

static int
next_concat(hd_context *ctx, hd_stream *stm, size_t max)
{
    struct concat_filter *state = (struct concat_filter *)stm->state;
    size_t n;

    while (state->current < state->count)
    {
        /* Read the next block of underlying data. */
        if (stm->wp == state->chain[state->current]->wp)
            state->chain[state->current]->rp = stm->wp;
        n = hd_available(ctx, state->chain[state->current], max);
        if (n)
        {
            stm->rp = state->chain[state->current]->rp;
            stm->wp = state->chain[state->current]->wp;
            stm->pos += (int64_t)n;
            return *stm->rp++;
        }
        else
        {
            if (state->chain[state->current]->error)
            {
                stm->error = 1;
                break;
            }
            state->current++;
            hd_drop_stream(ctx, state->chain[state->current-1]);
            if (state->pad)
            {
                stm->rp = (&state->ws_buf)+1;
                stm->wp = stm->rp + 1;
                stm->pos++;
                return 32;
            }
        }
    }

    stm->rp = stm->wp;

    return EOF;
}